

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O3

int __thiscall QFilePrivate::copy(QFilePrivate *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QObject *this_00;
  int *piVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Permissions permissions;
  FileError err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *__buf;
  void *pvVar6;
  undefined4 extraout_var_01;
  size_t __nbytes;
  int __oflag;
  undefined8 unaff_RBP;
  undefined7 uVar7;
  long in_FS_OFFSET;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  char block [4096];
  QString local_1098;
  QString local_1080;
  QSaveFile local_1068;
  QString local_1058;
  QString local_1038 [170];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
            super_QObjectData.q_ptr;
  iVar4 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
            super_QObjectData._vptr_QObjectData[7])();
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar4),dst);
  uVar7 = (undefined7)((ulong)unaff_RBP >> 8);
  iVar4 = (int)CONCAT71(uVar7,1);
  if (cVar2 != '\0') goto LAB_00235d6f;
  iVar4 = (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xd])(this_00,0x21);
  if ((char)iVar4 == '\0') {
    QMetaObject::tr(&local_1058,&QFile::staticMetaObject,"Cannot open %1 for input",(char *)0x0,-1);
    a_00.m_size = (this->fileName).d.size | 0x8000000000000000;
    a_00.field_0.m_data_utf16 = (this->fileName).d.ptr;
    QString::arg_impl(local_1038,&local_1058,a_00,0,(QChar)0x20);
    QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,local_1038);
    if (&(local_1038[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_1038[0].d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(local_1058.d.d._4_4_,local_1058.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_1058.d.d._4_4_,local_1058.d.d._0_4_),2,0x10);
      }
    }
    iVar4 = 0;
    goto LAB_00235d6f;
  }
  local_1068.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_1068.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QSaveFile::QSaveFile(&local_1068,(QString *)dst);
  QSaveFile::setDirectWriteFallback(&local_1068,true);
  iVar4 = QSaveFile::open(&local_1068,(char *)0x22,__oflag);
  if ((char)iVar4 == '\0') {
    (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
    QMetaObject::tr(&local_1058,&QFile::staticMetaObject,"Cannot open for output: %1",(char *)0x0,-1
                   );
    QIODevice::errorString(&local_1080,(QIODevice *)&local_1068);
    a_01.m_size = local_1080.d.size | 0x8000000000000000;
    a_01.field_0.m_data_utf16 = local_1080.d.ptr;
    QString::arg_impl(local_1038,&local_1058,a_01,0,(QChar)0x20);
    QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,local_1038);
LAB_00235cb0:
    if (&(local_1038[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_1038[0].d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1080.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1080.d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_00235d40:
    piVar1 = (int *)CONCAT44(local_1058.d.d._4_4_,local_1058.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        local_1038[0].d.d = (Data *)CONCAT44(local_1058.d.d._4_4_,local_1058.d.d._0_4_);
LAB_00235d54:
        QArrayData::deallocate(&(local_1038[0].d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_00235d63:
    iVar4 = 0;
  }
  else {
    iVar4 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
              super_QObjectData._vptr_QObjectData[7])(this);
    iVar5 = (*(local_1068.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d)->
              _vptr_QObjectData[7])();
    __nbytes = *(size_t *)CONCAT44(extraout_var_00,iVar4);
    cVar2 = (**(code **)(__nbytes + 0x100))((size_t *)CONCAT44(extraout_var_00,iVar4),iVar5);
    if (cVar2 == '\0') {
      (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
      QMetaObject::tr(&local_1058,&QFile::staticMetaObject,"Could not copy to %1: %2",(char *)0x0,-1
                     );
      iVar4 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
                super_QObjectData._vptr_QObjectData[7])(this);
      QAbstractFileEngine::errorString
                (&local_1080,(QAbstractFileEngine *)CONCAT44(extraout_var_01,iVar4));
      QString::arg<QString_const&,QString>(local_1038,&local_1058,(QString *)dst,&local_1080);
      QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,local_1038);
      goto LAB_00235cb0;
    }
    if (cVar2 == -1) {
      do {
        memset(local_1038,0xaa,0x1000);
        iVar4 = (int)local_1038;
        __buf = (void *)QIODevice::read((QIODevice *)this_00,iVar4,(void *)0x1000,__nbytes);
        if (__buf == (void *)0x0) goto LAB_00235bc7;
        if ((long)__buf < 0) {
          local_1058.d.d._0_4_ =
               *(undefined4 *)
                &(this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.d;
          local_1058.d.d._4_4_ =
               *(undefined4 *)
                ((long)&(this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.d + 4)
          ;
          local_1058.d.ptr._0_4_ =
               *(undefined4 *)
                &(this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.ptr;
          local_1058.d.ptr._4_4_ =
               *(undefined4 *)
                ((long)&(this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.ptr +
                4);
          (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.d = (Data *)0x0;
          (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.ptr =
               (char16_t *)0x0;
          local_1058.d.size =
               (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.size;
          (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.size = 0;
          (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
          QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,&local_1058);
          goto LAB_00235d40;
        }
        pvVar6 = (void *)QIODevice::write((QIODevice *)&local_1068,iVar4,__buf,__nbytes);
      } while (__buf == pvVar6);
      (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
      QMetaObject::tr(&local_1080,&QFile::staticMetaObject,"Failure to write block: %1",(char *)0x0,
                      -1);
      QIODevice::errorString(&local_1098,(QIODevice *)&local_1068);
      a.m_size = local_1098.d.size | 0x8000000000000000;
      a.field_0.m_data_utf16 = local_1098.d.ptr;
      QString::arg_impl(&local_1058,&local_1080,a,0,(QChar)0x20);
      QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,&local_1058);
      piVar1 = (int *)CONCAT44(local_1058.d.d._4_4_,local_1058.d.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_1058.d.d._4_4_,local_1058.d.d._0_4_),2,0x10);
        }
      }
      if (&(local_1098.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1098.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1098.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1098.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1098.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_1080.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        local_1038[0].d.d = local_1080.d.d;
        if (((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
        goto LAB_00235d63;
        goto LAB_00235d54;
      }
      goto LAB_00235d63;
    }
LAB_00235bc7:
    permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
    super_QFlagsStorage<QFileDevice::Permission>.i =
         (QFlagsStorageHelper<QFileDevice::Permission,_4>)
         (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0x1f])(this_00);
    QFileDevice::setPermissions(&local_1068.super_QFileDevice,permissions);
    (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
    bVar3 = QSaveFile::commit(&local_1068);
    iVar4 = (int)CONCAT71(uVar7,1);
    if (!bVar3) {
      err = QFileDevice::error(&local_1068.super_QFileDevice);
      QIODevice::errorString(local_1038,(QIODevice *)&local_1068);
      QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,err,local_1038);
      if (&(local_1038[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) goto LAB_00235d54;
      }
      goto LAB_00235d63;
    }
  }
  QSaveFile::~QSaveFile(&local_1068);
LAB_00235d6f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

bool QFilePrivate::copy(const QString &newName)
{
    Q_Q(QFile);
    Q_ASSERT(error == QFile::NoError);
    Q_ASSERT(!q->isOpen());

    // Some file engines can perform this copy more efficiently (e.g., Windows
    // calling CopyFile).
    if (engine()->copy(newName))
        return true;

    if (!q->open(QFile::ReadOnly | QFile::Unbuffered)) {
        setError(QFile::CopyError, QFile::tr("Cannot open %1 for input").arg(fileName));
        return false;
    }

    QSaveFile out(newName);
    out.setDirectWriteFallback(true);
    if (!out.open(QIODevice::WriteOnly | QIODevice::Unbuffered)) {
        q->close();
        setError(QFile::CopyError, QFile::tr("Cannot open for output: %1").arg(out.errorString()));
        return false;
    }

    // Attempt to do an OS-level data copy
    QAbstractFileEngine::TriStateResult r = engine()->cloneTo(out.d_func()->engine());
    if (r == QAbstractFileEngine::TriStateResult::Failed) {
        q->close();
        setError(QFile::CopyError, QFile::tr("Could not copy to %1: %2")
                 .arg(newName, engine()->errorString()));
        return false;
    }

    while (r == QAbstractFileEngine::TriStateResult::NotSupported) {
        // OS couldn't do it, so do a block-level copy
        char block[4096];
        qint64 in = q->read(block, sizeof(block));
        if (in == 0)
            break;      // eof
        if (in < 0) {
            // Unable to read from the source. Save the error from read() above.
            QString s = std::move(errorString);
            q->close();
            setError(QFile::CopyError, std::move(s));
            return false;
        }
        if (in != out.write(block, in)) {
            q->close();
            setError(QFile::CopyError, QFile::tr("Failure to write block: %1")
                     .arg(out.errorString()));
            return false;
        }
    }

    // copy the permissions
    out.setPermissions(q->permissions());
    q->close();

    // final step: commit the copy
    if (out.commit())
        return true;
    setError(out.error(), out.errorString());
    return false;
}